

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void template_conformglist(t_template *tfrom,t_template *tto,_glist *glist,int *conformaction)

{
  _array *a;
  _glist *local_30;
  t_gobj *g;
  int *conformaction_local;
  _glist *glist_local;
  t_template *tto_local;
  t_template *tfrom_local;
  
  for (local_30 = (_glist *)glist->gl_list; local_30 != (_glist *)0x0;
      local_30 = (_glist *)(local_30->gl_obj).te_g.g_next) {
    if ((local_30->gl_obj).te_g.g_pd == scalar_class) {
      local_30 = (_glist *)
                 template_conformscalar(tfrom,tto,conformaction,glist,(t_scalar *)local_30);
    }
    else if ((local_30->gl_obj).te_g.g_pd == canvas_class) {
      template_conformglist(tfrom,tto,local_30,conformaction);
    }
    else if ((local_30->gl_obj).te_g.g_pd == garray_class) {
      a = garray_getarray((_garray *)local_30);
      template_conformarray(tfrom,tto,conformaction,a);
    }
  }
  return;
}

Assistant:

static void template_conformglist(t_template *tfrom, t_template *tto,
    t_glist *glist,  int *conformaction)
{
    t_gobj *g;
    /* post("conform glist %s", glist->gl_name->s_name); */
    for (g = glist->gl_list; g; g = g->g_next)
    {
        if (pd_class(&g->g_pd) == scalar_class)
            g = &template_conformscalar(tfrom, tto, conformaction,
                glist, (t_scalar *)g)->sc_gobj;
        else if (pd_class(&g->g_pd) == canvas_class)
            template_conformglist(tfrom, tto, (t_glist *)g, conformaction);
        else if (pd_class(&g->g_pd) == garray_class)
            template_conformarray(tfrom, tto, conformaction,
                garray_getarray((t_garray *)g));
    }
}